

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str>
                (object *args_,str *args__1)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  handle *this;
  undefined8 uVar4;
  PyObject **ppPVar5;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_2UL> *__range2;
  int counter;
  size_t i;
  array<pybind11::object,_2UL> args;
  size_t size;
  tuple *result;
  PyTypeObject *in_stack_fffffffffffffee8;
  array<pybind11::object,_2UL> *in_stack_fffffffffffffef0;
  handle in_stack_fffffffffffffef8;
  array<pybind11::object,_2UL> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  tuple *in_stack_ffffffffffffff10;
  handle local_a0;
  iterator local_98;
  iterator local_90;
  iterator local_88;
  array<pybind11::object,_2UL> *local_80;
  int local_78;
  undefined1 local_71;
  ulong local_70;
  handle local_68;
  PyObject *local_60;
  handle local_48;
  PyObject *local_40;
  object *local_38;
  array<pybind11::object,_2UL> local_30;
  undefined8 local_20;
  
  local_20 = 2;
  local_38 = local_30._M_elems;
  handle::handle(&local_48,(PyObject *)0x0);
  local_40 = (PyObject *)
             detail::pyobject_caster<pybind11::object>::cast
                       ((handle *)in_stack_fffffffffffffef0,
                        (return_value_policy)((ulong)in_stack_fffffffffffffee8 >> 0x38),
                        in_stack_fffffffffffffef8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffef8);
  local_38 = local_30._M_elems + 1;
  handle::handle(&local_68,(PyObject *)0x0);
  local_60 = (PyObject *)
             detail::pyobject_caster<pybind11::str>::cast
                       ((handle *)in_stack_fffffffffffffef0,
                        (return_value_policy)((ulong)in_stack_fffffffffffffee8 >> 0x38),
                        in_stack_fffffffffffffef8);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffef8);
  local_70 = 0;
  while( true ) {
    uVar1 = local_70;
    sVar3 = std::array<pybind11::object,_2UL>::size(&local_30);
    if (sVar3 <= uVar1) {
      local_71 = 0;
      tuple::tuple(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_78 = 0;
      local_80 = &local_30;
      local_88 = std::array<pybind11::object,_2UL>::begin((array<pybind11::object,_2UL> *)0x3a0e44);
      local_90 = std::array<pybind11::object,_2UL>::end((array<pybind11::object,_2UL> *)0x3a0e59);
      for (; local_88 != local_90; local_88 = local_88 + 1) {
        local_98 = local_88;
        local_a0 = object::release((object *)in_stack_fffffffffffffee8);
        ppPVar5 = handle::ptr(&local_a0);
        in_stack_fffffffffffffee8 = (PyTypeObject *)*ppPVar5;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar5)[1].ob_type)[local_78] = in_stack_fffffffffffffee8;
        local_78 = local_78 + 1;
      }
      local_71 = 1;
      std::array<pybind11::object,_2UL>::~array(in_stack_ffffffffffffff00);
      return (tuple)in_RDI.super_handle.m_ptr;
    }
    this = &std::array<pybind11::object,_2UL>::operator[]
                      (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8)->super_handle
    ;
    bVar2 = handle::operator_cast_to_bool(this);
    if (!bVar2) break;
    local_70 = local_70 + 1;
  }
  uVar4 = __cxa_allocate_exception(0x10);
  cast_error::runtime_error
            ((cast_error *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  __cxa_throw(uVar4,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}